

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_hmac_sha256(void)

{
  ptls_hash_algorithm_t *algo;
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var1;
  undefined8 uVar2;
  int iVar3;
  ptls_cipher_suite_t *ppVar4;
  size_t sVar5;
  ptls_hash_context_t *ppVar6;
  ptls_hash_context_t *hctx;
  uint8_t digest [32];
  char *message;
  char *secret;
  
  digest._24_8_ = anon_var_dwarf_6c90;
  ppVar4 = find_aes128gcmsha256(ctx);
  algo = ppVar4->hash;
  sVar5 = strlen("\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v");
  ppVar6 = ptls_hmac_create(algo,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",sVar5);
  uVar2 = digest._24_8_;
  p_Var1 = ppVar6->update;
  sVar5 = strlen((char *)digest._24_8_);
  (*p_Var1)(ppVar6,(void *)uVar2,sVar5);
  (*ppVar6->final)(ppVar6,&hctx,PTLS_HASH_FINAL_MODE_FREE);
  iVar3 = memcmp(&hctx,anon_var_dwarf_6c9a,0x20);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x34);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There";
    uint8_t digest[32];

    ptls_hash_context_t *hctx = ptls_hmac_create(find_aes128gcmsha256(ctx)->hash, secret, strlen(secret));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, 0);

    ok(memcmp(digest, "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                      "\x6c\x2e\x32\xcf\xf7",
              32) == 0);
}